

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lj_asm_x86.h
# Opt level: O2

Reg asm_setup_call_slots(ASMState *as,IRIns *ir,CCallInfo *ci)

{
  uint32_t nargs;
  int nslots;
  int iVar1;
  int iVar2;
  int iVar3;
  ulong uVar4;
  IRRef args [64];
  
  asm_collectargs(as,ir,ci,args);
  iVar2 = 8;
  iVar3 = 6;
  uVar4 = 0;
  iVar1 = 0;
  do {
    if ((byte)ci->flags == uVar4) {
      if (as->evenspill < iVar1) {
        as->evenspill = iVar1;
      }
      return ((byte)(((ir->field_1).t.irt & 0x1f) - 0xd) < 2 | 8) << 4;
    }
    if (((ulong)args[uVar4] == 0) ||
       (1 < (byte)((*(byte *)((long)as->ir + (ulong)args[uVar4] * 8 + 4) & 0x1f) - 0xd))) {
      if (iVar3 < 1) goto LAB_00133cde;
      iVar3 = iVar3 + -1;
    }
    else if (iVar2 < 1) {
LAB_00133cde:
      iVar1 = iVar1 + 2;
    }
    else {
      iVar2 = iVar2 + -1;
    }
    uVar4 = uVar4 + 1;
  } while( true );
}

Assistant:

static Reg asm_setup_call_slots(ASMState *as, IRIns *ir, const CCallInfo *ci)
{
  IRRef args[CCI_NARGS_MAX*2];
  int nslots;
  asm_collectargs(as, ir, ci, args);
  nslots = asm_count_call_slots(as, ci, args);
  if (nslots > as->evenspill)  /* Leave room for args in stack slots. */
    as->evenspill = nslots;
#if LJ_64
  return irt_isfp(ir->t) ? REGSP_HINT(RID_FPRET) : REGSP_HINT(RID_RET);
#else
  return irt_isfp(ir->t) ? REGSP_INIT : REGSP_HINT(RID_RET);
#endif
}